

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O1

void err_set_logfp(FILE *stream)

{
  if (((logfp != (FILE *)0x0) && (logfp != _stdout)) && (logfp != _stderr)) {
    fclose((FILE *)logfp);
  }
  logfp_disabled = stream == (FILE *)0x0;
  logfp = stream;
  return;
}

Assistant:

void
err_set_logfp(FILE *stream)
{
    if (logfp != NULL && logfp != stdout && logfp != stderr)
        fclose(logfp);
    if (stream == NULL) {
	logfp_disabled = TRUE;
	logfp = NULL;
	return;
    }    
    logfp_disabled = FALSE;
    logfp = stream;
    return;
}